

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::moveFromOldBuckets
          (DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           *this,DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *OldBucketsBegin,
          DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          *OldBucketsEnd)

{
  bool bVar1;
  DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_RAX;
  DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *ConstFoundBucket;
  DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *local_28
  ;
  
  local_28 = in_RAX;
  initEmpty(this);
  if (OldBucketsBegin != OldBucketsEnd) {
    do {
      if ((OldBucketsBegin->
          super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>).
          first < 0xfffffffffffffffe) {
        bVar1 = LookupBucketFor<unsigned_long>(this,(unsigned_long *)OldBucketsBegin,&local_28);
        if (bVar1) {
          __assert_fail("!FoundVal && \"Key already in new map?\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                        ,0x176,
                        "void llvm::DenseMapBase<llvm::DenseMap<unsigned long, std::vector<unsigned char>>, unsigned long, std::vector<unsigned char>, llvm::DenseMapInfo<unsigned long>, llvm::detail::DenseMapPair<unsigned long, std::vector<unsigned char>>>::moveFromOldBuckets(BucketT *, BucketT *) [DerivedT = llvm::DenseMap<unsigned long, std::vector<unsigned char>>, KeyT = unsigned long, ValueT = std::vector<unsigned char>, KeyInfoT = llvm::DenseMapInfo<unsigned long>, BucketT = llvm::detail::DenseMapPair<unsigned long, std::vector<unsigned char>>]"
                       );
        }
        (local_28->
        super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>).
        first = (OldBucketsBegin->
                super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ).first;
        (local_28->
        super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>).
        second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (OldBucketsBegin->
             super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             .second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        (local_28->
        super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>).
        second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (OldBucketsBegin->
             super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             .second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (local_28->
        super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>).
        second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (OldBucketsBegin->
             super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             .second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        (OldBucketsBegin->
        super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>).
        second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (OldBucketsBegin->
        super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>).
        second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (OldBucketsBegin->
        super_pair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>).
        second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(int *)(this + 8) = *(int *)(this + 8) + 1;
      }
      OldBucketsBegin = OldBucketsBegin + 1;
    } while (OldBucketsBegin != OldBucketsEnd);
  }
  return;
}

Assistant:

void moveFromOldBuckets(BucketT *OldBucketsBegin, BucketT *OldBucketsEnd) {
    initEmpty();

    // Insert all the old elements.
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    for (BucketT *B = OldBucketsBegin, *E = OldBucketsEnd; B != E; ++B) {
      if (!KeyInfoT::isEqual(B->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(B->getFirst(), TombstoneKey)) {
        // Insert the key/value into the new table.
        BucketT *DestBucket;
        bool FoundVal = LookupBucketFor(B->getFirst(), DestBucket);
        (void)FoundVal; // silence warning.
        assert(!FoundVal && "Key already in new map?");
        DestBucket->getFirst() = std::move(B->getFirst());
        ::new (&DestBucket->getSecond()) ValueT(std::move(B->getSecond()));
        incrementNumEntries();

        // Free the value.
        B->getSecond().~ValueT();
      }
      B->getFirst().~KeyT();
    }
  }